

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.h
# Opt level: O2

void __thiscall
gimage::Histogram::Histogram<unsigned_short>
          (Histogram *this,Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *image1,
          Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *image2,int binsize)

{
  int iVar1;
  unsigned_short ***pppuVar2;
  unsigned_short ***pppuVar3;
  unsigned_long **ppuVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int i;
  long lVar8;
  int d;
  long lVar9;
  
  this->bs = 0;
  this->w = 0;
  this->h = 0;
  this->val = (unsigned_long *)0x0;
  this->row = (unsigned_long **)0x0;
  iVar5 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::maxValue(image1);
  if (0xffff < iVar5) {
    iVar5 = 0x10000;
  }
  if (iVar5 < 0x101) {
    iVar5 = 0x100;
  }
  iVar6 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::maxValue(image2);
  if (0xffff < iVar6) {
    iVar6 = 0x10000;
  }
  if (iVar6 < 0x101) {
    iVar6 = 0x100;
  }
  setSize(this,iVar5 / binsize,iVar6 / binsize,binsize);
  clear(this);
  for (lVar7 = 0; (lVar7 < image1->height && (lVar7 < image2->height)); lVar7 = lVar7 + 1) {
    iVar5 = image1->depth;
    for (lVar8 = 0; (lVar8 < image1->width && (lVar8 < image2->width)); lVar8 = lVar8 + 1) {
      pppuVar2 = image1->img;
      iVar6 = this->w;
      iVar1 = this->h;
      pppuVar3 = image2->img;
      ppuVar4 = this->row;
      for (lVar9 = 0; (lVar9 < iVar5 && (lVar9 < image2->depth)); lVar9 = lVar9 + 1) {
        if (((int)(uint)pppuVar2[lVar9][lVar7][lVar8] < (iVar6 + 1) * binsize + -1) &&
           ((int)(uint)pppuVar3[lVar9][lVar7][lVar8] < (iVar1 + 1) * binsize + -1)) {
          ppuVar4[(int)((long)(ulong)pppuVar3[lVar9][lVar7][lVar8] / (long)binsize)]
          [(int)((long)(ulong)pppuVar2[lVar9][lVar7][lVar8] / (long)binsize)] =
               ppuVar4[(int)((long)(ulong)pppuVar3[lVar9][lVar7][lVar8] / (long)binsize)]
               [(int)((long)(ulong)pppuVar2[lVar9][lVar7][lVar8] / (long)binsize)] + 1;
        }
      }
    }
  }
  return;
}

Assistant:

Histogram(const Image<T> &image1, const Image<T> &image2, int binsize=1)
    {
      w=h=bs=0;
      val=0;
      row=0;

      int width=std::max(256, std::min(65536, static_cast<int>(image1.maxValue())))/binsize;
      int height=std::max(256, std::min(65536, static_cast<int>(image2.maxValue())))/binsize;
      setSize(width, height, binsize);
      clear();

      for (int k=0; k<image1.getHeight() && k < image2.getHeight(); k++)
      {
        for (int i=0; i<image1.getWidth() && i < image2.getWidth(); i++)
        {
          if (image1.isValid(i, k) && image2.isValid(i, k))
          {
            for (int d=0; d<image1.getDepth() && d < image2.getDepth(); d++)
            {
              T v1=image1.get(i, k, d);
              T v2=image2.get(i, k, d);

              if (v1 < w*binsize+binsize-1 && v2 < h*binsize+binsize-1)
              {
                row[static_cast<int>(v2)/binsize][static_cast<int>(v1)/binsize]++;
              }
            }
          }
        }
      }
    }